

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_vector.c
# Opt level: O0

exr_result_t
exr_attr_string_vector_init_entry
          (exr_context_t ctxt,exr_attr_string_vector_t *sv,int32_t idx,int32_t len)

{
  int in_EDX;
  int *in_RSI;
  exr_attr_string_t *in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  exr_result_t eVar1;
  
  if (in_RDI == (exr_attr_string_t *)0x0) {
    eVar1 = 2;
  }
  else if (in_RSI == (int *)0x0) {
    eVar1 = (*(code *)in_RDI[4].str)
                      (in_RDI,3,"Invalid reference to string vector object to initialize index %d",
                       in_EDX);
  }
  else if ((in_EDX < 0) || (*in_RSI <= in_EDX)) {
    eVar1 = (*(code *)in_RDI[4].str)
                      (in_RDI,3,"Invalid index (%d of %d) initializing string vector",in_EDX,*in_RSI
                      );
  }
  else {
    eVar1 = exr_attr_string_init
                      ((exr_context_t)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_RDI,(int32_t)((ulong)in_RSI >> 0x20));
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_string_vector_init_entry (
    exr_context_t ctxt, exr_attr_string_vector_t* sv, int32_t idx, int32_t len)
{
    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (sv)
    {
        if (idx < 0 || idx >= sv->n_strings)
            return ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid index (%d of %d) initializing string vector",
                idx,
                sv->n_strings);

        return exr_attr_string_init (
            ctxt, EXR_CONST_CAST (exr_attr_string_t*, sv->strings + idx), len);
    }

    return ctxt->print_error (
        ctxt,
        EXR_ERR_INVALID_ARGUMENT,
        "Invalid reference to string vector object to initialize index %d",
        idx);
}